

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O0

int32_t __thiscall wasm::BinaryInstWriter::getBreakIndex(BinaryInstWriter *this,Name name)

{
  bool bVar1;
  size_type sVar2;
  IString *this_00;
  int local_2c;
  int i;
  BinaryInstWriter *this_local;
  Name name_local;
  
  name_local.super_IString.str._M_len = name.super_IString.str._M_str;
  this_local = name.super_IString.str._M_len;
  bVar1 = IString::operator==((IString *)&this_local,(IString *)&DELEGATE_CALLER_TARGET);
  if (bVar1) {
    sVar2 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::size(&this->breakStack);
    name_local.super_IString.str._M_str._4_4_ = (int)sVar2;
  }
  else {
    sVar2 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::size(&this->breakStack);
    local_2c = (int)sVar2;
    do {
      local_2c = local_2c + -1;
      if (local_2c < 0) {
        handle_unreachable("break index not found",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                           ,0xc04);
      }
      this_00 = &std::vector<wasm::Name,_std::allocator<wasm::Name>_>::operator[]
                           (&this->breakStack,(long)local_2c)->super_IString;
      bVar1 = IString::operator==(this_00,(IString *)&this_local);
    } while (!bVar1);
    sVar2 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::size(&this->breakStack);
    name_local.super_IString.str._M_str._4_4_ = ((int)sVar2 + -1) - local_2c;
  }
  return name_local.super_IString.str._M_str._4_4_;
}

Assistant:

int32_t BinaryInstWriter::getBreakIndex(Name name) { // -1 if not found
  if (name == DELEGATE_CALLER_TARGET) {
    return breakStack.size();
  }
  for (int i = breakStack.size() - 1; i >= 0; i--) {
    if (breakStack[i] == name) {
      return breakStack.size() - 1 - i;
    }
  }
  WASM_UNREACHABLE("break index not found");
}